

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
S2Builder::Graph::GetMinInputEdgeIds
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Graph *this)

{
  InputEdgeId IVar1;
  EdgeId e;
  long lVar2;
  allocator_type local_19;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(int)((ulong)((long)(this->edges_->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3),&local_19);
  for (lVar2 = 0;
      lVar2 < (int)((ulong)((long)(this->edges_->
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->edges_->
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3);
      lVar2 = lVar2 + 1) {
    IVar1 = min_input_edge_id(this,(EdgeId)lVar2);
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar2] = IVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<S2Builder::InputEdgeId> Graph::GetMinInputEdgeIds() const {
  vector<InputEdgeId> min_input_ids(num_edges());
  for (EdgeId e = 0; e < num_edges(); ++e) {
    min_input_ids[e] = min_input_edge_id(e);
  }
  return min_input_ids;
}